

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O1

void background_thread0_work(tsd_t *tsd)

{
  malloc_mutex_t *pmVar1;
  uint64_t *puVar2;
  witness_t **ppwVar3;
  int8_t *piVar4;
  pthread_mutex_t *__mutex;
  long lVar5;
  background_thread_info_t *thread;
  _Bool _Var6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  pthread_attr_t *ppVar10;
  background_thread_info_t *pbVar11;
  _func_void_ptr_void_ptr *extraout_RDX;
  _func_void_ptr_void_ptr *extraout_RDX_00;
  _func_void_ptr_void_ptr *start_routine;
  char *pcVar12;
  pthread_attr_t *ppVar13;
  bool bVar14;
  size_t sVar15;
  pthread_attr_t *ppVar16;
  undefined8 uStack_60;
  char acStack_58 [8];
  pthread_attr_t *local_50;
  pthread_attr_t *local_48;
  background_thread_info_t *local_40;
  background_thread_state_t local_38;
  uint local_34;
  
  lVar5 = -(duckdb_je_max_background_threads + 0xf & 0xfffffffffffffff0);
  pcVar12 = acStack_58 + lVar5;
  if (1 < duckdb_je_max_background_threads) {
    uVar9 = 1;
    uVar7 = 2;
    do {
      pcVar12[uVar9] = '\0';
      uVar9 = (ulong)uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar9 < duckdb_je_max_background_threads);
  }
  local_48 = (pthread_attr_t *)duckdb_je_max_background_threads;
  sVar15 = 1;
  do {
    do {
      if (duckdb_je_background_thread_info->state == background_thread_stopped) {
        if ((pthread_attr_t *)&DAT_00000001 < local_48) {
          ppVar10 = (pthread_attr_t *)&DAT_00000001;
          ppVar13 = (pthread_attr_t *)0x2;
          ppVar16 = local_48;
          do {
            pbVar11 = duckdb_je_background_thread_info + (long)ppVar10;
            if (ppVar10->__size[(long)pcVar12] == '\x01') {
              *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1d98b89;
              background_threads_disable_single(tsd,pbVar11);
            }
            else {
              __mutex = (pthread_mutex_t *)((long)&(pbVar11->mtx).field_0 + 0x48);
              *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1d98b9a;
              iVar8 = pthread_mutex_trylock(__mutex);
              if (iVar8 != 0) {
                *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1d98ba7;
                duckdb_je_malloc_mutex_lock_slow(&pbVar11->mtx);
                (pbVar11->mtx).field_0.field_0.locked.repr = true;
              }
              puVar2 = &(pbVar11->mtx).field_0.field_0.prof_data.n_lock_ops;
              *puVar2 = *puVar2 + 1;
              if (&((pbVar11->mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
                (pbVar11->mtx).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
                ppwVar3 = &(pbVar11->mtx).field_0.witness.link.qre_prev;
                *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
              }
              if (pbVar11->state != background_thread_stopped) {
                duckdb_je_n_background_threads = duckdb_je_n_background_threads - 1;
                pbVar11->state = background_thread_stopped;
              }
              (pbVar11->mtx).field_0.field_0.locked.repr = false;
              *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1d98bea;
              pthread_mutex_unlock(__mutex);
              ppVar16 = local_48;
            }
            bVar14 = ppVar13 < ppVar16;
            ppVar10 = ppVar13;
            ppVar13 = (pthread_attr_t *)(ulong)((int)ppVar13 + 1);
          } while (bVar14);
        }
        duckdb_je_background_thread_info->state = background_thread_stopped;
        return;
      }
      *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1d989d7;
      _Var6 = background_thread_pause_check((tsdn_t *)tsd,duckdb_je_background_thread_info);
      pbVar11 = duckdb_je_background_thread_info;
    } while (_Var6);
    if (duckdb_je_n_background_threads == sVar15) {
      bVar14 = false;
    }
    else {
      (duckdb_je_background_thread_info->mtx).field_0.field_0.locked.repr = false;
      *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1d98a14;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(pbVar11->mtx).field_0 + 0x48));
      if (local_48 < (pthread_attr_t *)0x2) {
        bVar14 = false;
      }
      else {
        ppVar10 = (pthread_attr_t *)&DAT_00000001;
        uVar7 = 2;
        bVar14 = false;
        do {
          if (ppVar10->__size[(long)pcVar12] == '\0') {
            local_40 = duckdb_je_background_thread_info + (long)ppVar10;
            local_50 = ppVar10;
            local_34 = uVar7;
            *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1d98a61;
            iVar8 = pthread_mutex_trylock
                              ((pthread_mutex_t *)
                               ((long)&duckdb_je_background_thread_info[(long)ppVar10].mtx.field_0 +
                               0x48));
            if (iVar8 != 0) {
              pmVar1 = &local_40->mtx;
              *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1d98a76;
              duckdb_je_malloc_mutex_lock_slow(pmVar1);
              (local_40->mtx).field_0.field_0.locked.repr = true;
            }
            pbVar11 = local_40;
            puVar2 = &(local_40->mtx).field_0.field_0.prof_data.n_lock_ops;
            *puVar2 = *puVar2 + 1;
            if (&((local_40->mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
              (local_40->mtx).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
              ppwVar3 = &(local_40->mtx).field_0.witness.link.qre_prev;
              *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
            }
            local_38 = local_40->state;
            (local_40->mtx).field_0.field_0.locked.repr = false;
            pmVar1 = &local_40->mtx;
            *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1d98aa9;
            pthread_mutex_unlock((pthread_mutex_t *)((long)&pmVar1->field_0 + 0x48));
            if (local_38 == background_thread_started) {
              tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
                   tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level +
                   '\x01';
              start_routine = extraout_RDX;
              if ((tsd->state).repr == '\0') {
                *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1d98ac3;
                duckdb_je_tsd_slow_update(tsd);
                start_routine = extraout_RDX_00;
              }
              thread = local_40;
              ppVar10 = local_50;
              *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1d98ad0;
              uVar7 = background_thread_create_signals_masked
                                (&thread->thread,ppVar10,start_routine,pbVar11);
              piVar4 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
              *piVar4 = *piVar4 + -1;
              if (*piVar4 == '\0') {
                *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1d98ae0;
                duckdb_je_tsd_slow_update(tsd);
              }
              if (uVar7 == 0) {
                sVar15 = (size_t)((int)sVar15 + 1);
                local_50->__size[(long)pcVar12] = '\x01';
                bVar14 = true;
              }
              else {
                *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1d98af6;
                duckdb_je_malloc_printf
                          ("<jemalloc>: background thread creation failed (%d)\n",(ulong)uVar7);
                bVar14 = true;
                if (duckdb_je_opt_abort == true) {
                  *(code **)((long)&uStack_60 + lVar5) = background_thread_pause_check;
                  abort();
                }
              }
            }
            uVar7 = local_34;
            if (local_38 == background_thread_started) break;
          }
          ppVar10 = (pthread_attr_t *)(ulong)uVar7;
          uVar7 = uVar7 + 1;
        } while (ppVar10 < local_48);
      }
      *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1d98b48;
      malloc_mutex_lock((tsdn_t *)tsd,&duckdb_je_background_thread_info->mtx);
    }
    if (!bVar14) {
      *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1d98a01;
      background_work_sleep_once((tsdn_t *)tsd,duckdb_je_background_thread_info,0);
    }
  } while( true );
}

Assistant:

static void
background_thread0_work(tsd_t *tsd) {
	/*
	 * Thread0 is also responsible for launching / terminating threads.
	 * We are guaranteed that `max_background_threads` will not change
	 * underneath us. Unfortunately static analysis tools do not understand
	 * this, so we are extracting `max_background_threads` into a local
	 * variable solely for the sake of exposing this information to such
	 * tools.
	 */
	const size_t const_max_background_threads = max_background_threads;
	assert(const_max_background_threads > 0);
	VARIABLE_ARRAY(bool, created_threads, const_max_background_threads);
	unsigned i;
	for (i = 1; i < const_max_background_threads; i++) {
		created_threads[i] = false;
	}
	/* Start working, and create more threads when asked. */
	unsigned n_created = 1;
	while (background_thread_info[0].state != background_thread_stopped) {
		if (background_thread_pause_check(tsd_tsdn(tsd),
		    &background_thread_info[0])) {
			continue;
		}
		if (check_background_thread_creation(tsd, const_max_background_threads,
		    &n_created, (bool *)&created_threads)) {
			continue;
		}
		background_work_sleep_once(tsd_tsdn(tsd),
		    &background_thread_info[0], 0);
	}

	/*
	 * Shut down other threads at exit.  Note that the ctl thread is holding
	 * the global background_thread mutex (and is waiting) for us.
	 */
	assert(!background_thread_enabled());
	for (i = 1; i < const_max_background_threads; i++) {
		background_thread_info_t *info = &background_thread_info[i];
		assert(info->state != background_thread_paused);
		if (created_threads[i]) {
			background_threads_disable_single(tsd, info);
		} else {
			malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
			if (info->state != background_thread_stopped) {
				/* The thread was not created. */
				assert(info->state ==
				    background_thread_started);
				n_background_threads--;
				info->state = background_thread_stopped;
			}
			malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);
		}
	}
	background_thread_info[0].state = background_thread_stopped;
	assert(n_background_threads == 1);
}